

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnData::InitializeScan(ArrayColumnData *this,ColumnScanState *state)

{
  reference pvVar1;
  pointer pCVar2;
  undefined8 extraout_RDX;
  
  state->row_index = 0;
  state->current = (ColumnSegment *)0x0;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,0);
  ColumnData::InitializeScan(&(this->validity).super_ColumnData,pvVar1);
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,1);
  (*pCVar2->_vptr_ColumnData[7])(pCVar2,pvVar1,extraout_RDX,pCVar2->_vptr_ColumnData[7]);
  return;
}

Assistant:

void ArrayColumnData::InitializeScan(ColumnScanState &state) {
	// initialize the validity segment
	D_ASSERT(state.child_states.size() == 2);

	state.row_index = 0;
	state.current = nullptr;

	validity.InitializeScan(state.child_states[0]);

	// initialize the child scan
	child_column->InitializeScan(state.child_states[1]);
}